

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O3

int thitmonst(monst *mon,obj *obj,obj *ostack)

{
  byte *pbVar1;
  short sVar2;
  permonst *ppVar3;
  boolean bVar4;
  schar sVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  undefined7 extraout_var;
  monst *pmVar15;
  byte bVar16;
  obj *poVar17;
  ushort uVar18;
  int iVar19;
  bool bVar20;
  undefined4 in_stack_fffffffffffffea8;
  char cVar21;
  undefined4 uVar22;
  char local_138 [6];
  undefined8 uStack_132;
  undefined4 auStack_128 [62];
  
  uVar18 = obj->otyp;
  bVar16 = u.ustuck == mon & u._1052_1_;
  if ((((mon->data == mons + 0xdb) && ((mon->field_0x61 & 1) == 0)) && (1 < mon->mhp)) &&
     ((objects[(short)uVar18].oc_oprop != '\x04' && (bVar4 = obj_resists(obj,5,0x32), bVar4 == '\0')
      ))) {
    bVar4 = is_quest_artifact(obj);
    uVar22 = (undefined4)CONCAT71(extraout_var,bVar4 == '\0');
  }
  else {
    uVar22 = 0;
  }
  sVar2 = (short)((uint)(((int)u.moreluck + (int)u.uluck) * 0x5556) >> 0x10);
  iVar7 = find_mac(mon);
  iVar19 = u.ulevel;
  if (u.umonnum != u.umonster) {
    iVar19 = (int)(youmonst.data)->mlevel;
  }
  iVar19 = iVar7 + u.uhitinc + iVar19 + (int)(short)((sVar2 - (sVar2 >> 0xf)) + -1);
  sVar5 = acurr(3);
  if (sVar5 < '\x04') {
    iVar19 = iVar19 + -3;
  }
  else {
    sVar5 = acurr(3);
    if (sVar5 < '\x06') {
      iVar19 = iVar19 + -2;
    }
    else {
      sVar5 = acurr(3);
      if (sVar5 < '\b') {
        iVar19 = iVar19 + -1;
      }
      else {
        sVar5 = acurr(3);
        if ('\r' < sVar5) {
          sVar5 = acurr(3);
          iVar19 = iVar19 + sVar5 + -0xe;
        }
      }
    }
  }
  iVar8 = distmin((int)u.ux,(int)u.uy,(int)mon->mx,(int)mon->my);
  iVar7 = -4;
  if (-4 < 3 - iVar8) {
    iVar7 = 3 - iVar8;
  }
  iVar7 = iVar7 + iVar19;
  if ((uwep != (obj *)0x0 && uarmg != (obj *)0x0) && (objects[uwep->otyp].oc_subtyp == '\x16')) {
    switch(uarmg->otyp) {
    case 0x8f:
    case 0x92:
      break;
    case 0x90:
      iVar7 = iVar7 + -3;
      break;
    case 0x91:
      iVar7 = iVar7 + -2;
      break;
    default:
      warning("Unknown type of gloves (%d)",(ulong)(uint)(int)uarmg->otyp);
    }
  }
  iVar19 = omon_adj(mon,obj,'\x01');
  iVar19 = iVar19 + iVar7;
  uVar10 = mon->data->mflags2;
  if ((char)uVar10 < '\0') {
    if (u.umonnum == u.umonster) {
      if (urace.malenum == 0x111) {
LAB_00181679:
        iVar19 = iVar19 + 1;
      }
    }
    else if (((youmonst.data)->mflags2 & 0x10) != 0) goto LAB_00181679;
  }
  iVar7 = iVar19 + 1000;
  if (bVar16 == 0) {
    iVar7 = iVar19;
  }
  if (((obj->oclass != '\r') || ((uVar10 >> 0x1d & 1) == 0)) || (mon->data->mlet != '\x15')) {
    if (((obj->oartifact != '\0') && (bVar4 = is_quest_artifact(obj), bVar4 != '\0')) &&
       (mon->data->msound == '\x1f')) {
      uVar10 = *(uint *)&mon->field_0x60;
      *(uint *)&mon->field_0x60 = uVar10 & 0xfff7ffff;
      pbVar1 = (byte *)((long)&mon->mstrategy + 3);
      *pbVar1 = *pbVar1 & 0xcf;
      if ((uVar10 >> 0x12 & 1) == 0) {
        return 0;
      }
      pcVar11 = Monnam(mon);
      pcVar12 = xname(obj);
      pcVar12 = the(pcVar12);
      pline("%s catches %s.",pcVar11,pcVar12);
      if ((mon->field_0x62 & 0x40) == 0) {
        mpickobj(mon,obj);
        return 1;
      }
      bVar4 = monnear(mon,(int)u.ux,(int)u.uy);
      finish_quest(obj);
      pcVar11 = Monnam(mon);
      pcVar12 = "hands";
      if (bVar4 == '\0') {
        pcVar12 = "tosses";
      }
      pcVar14 = xname(obj);
      pcVar14 = the(pcVar14);
      pline("%s %s %s back to you.",pcVar11,pcVar12,pcVar14);
      if (bVar4 == '\0') {
        iVar19 = sgn((int)mon->mx - (int)u.ux);
        iVar7 = sgn((int)mon->my - (int)u.uy);
        sho_obj_return_to_u(obj,(schar)iVar19,(schar)iVar7);
      }
      addinv((obj *)CONCAT44(uVar22,in_stack_fffffffffffffea8));
      encumber_msg();
      return 1;
    }
    cVar21 = (char)uVar22;
    cVar6 = obj->oclass;
    if ((cVar6 == '\x02') || (cVar6 == '\r')) {
      if (2 < (byte)(objects[obj->otyp].oc_subtyp + 0x18U)) goto LAB_00181973;
      if ((((cVar6 == '\r') || (cVar6 == '\x02')) && (uwep != (obj *)0x0)) &&
         ((int)objects[obj->otyp].oc_subtyp + (int)objects[uwep->otyp].oc_subtyp == 0)) {
        cVar6 = uwep->spe;
        uVar9 = *(uint *)&uwep->field_0x4a >> 8 & 3;
        uVar10 = *(uint *)&uwep->field_0x4a >> 10 & 3;
        if (uVar10 < uVar9) {
          uVar10 = uVar9;
        }
        iVar19 = weapon_hit_bonus(uwep);
        iVar7 = (iVar7 + iVar19 + cVar6) - uVar10;
        if (uwep->oartifact != '\0') {
          iVar19 = spec_abon(uwep,mon);
          iVar7 = iVar19 + iVar7;
        }
        iVar19 = iVar7;
        if (((urole.malenum == 0x165 || urace.malenum == 0x111) &&
            ((u.umonnum == u.umonster || (((youmonst.data)->mflags2 & (int)urace.selfmask) != 0))))
           && (sVar2 = uwep->otyp, objects[sVar2].oc_subtyp == '\x16')) {
          if (sVar2 == 0x43 && urace.malenum == 0x111) {
            iVar19 = iVar7 + 2;
          }
          else {
            iVar19 = iVar7 + 1;
            if ((urole.malenum == 0x165) && (sVar2 == 0x45)) {
              iVar19 = iVar7 + 2;
            }
          }
        }
      }
      else {
        iVar19 = iVar7 + -4;
      }
    }
    else {
      if ((cVar6 != '\x06') || (objects[obj->otyp].oc_subtyp == '\0')) {
        if (uVar18 < 0x216) {
          if ((uVar18 != 0x10f) && (uVar18 != 0x120)) {
            if (uVar18 == 0x214) {
              exercise(0,'\x01');
              uVar10 = mt_random();
              if (iVar7 <= (int)(uVar10 % 0x14)) {
LAB_00181e8b:
                tmiss(obj,mon);
                return 0;
              }
              exercise(3,'\x01');
              hmon(mon,obj,ostack,'\x01');
LAB_00181d1d:
              if (cVar21 != '\0') {
                if (u.ushops[0] != '\0') {
                  check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
                }
                obfree(obj,(obj *)0x0);
                return 1;
              }
              return 0;
            }
            goto LAB_00181e21;
          }
LAB_00181ae9:
          if (bVar16 != 0) {
LAB_00181b23:
            hmon(mon,obj,ostack,'\x01');
            return 1;
          }
          sVar5 = acurr(3);
          uVar10 = mt_random();
          if ((int)(uVar10 % 0x19 + 1) < (int)sVar5) goto LAB_00181b23;
          cVar6 = obj->oclass;
          if (cVar6 == '\b') goto LAB_00181e3b;
        }
        else {
          if (uVar18 - 0x218 < 2) goto LAB_00181ae9;
          if (uVar18 == 0x216) {
            exercise(0,'\x01');
            uVar10 = mt_random();
            if (iVar7 <= (int)(uVar10 % 0x14)) goto LAB_00181e8b;
            exercise(3,'\x01');
            bVar4 = hmon(mon,obj,ostack,'\x01');
            if ((((bVar4 == '\0' & bVar16) == 1) && ((u._1052_1_ & 1) == 0)) && (uball == obj)) {
              return 1;
            }
            goto LAB_00181d1d;
          }
LAB_00181e21:
          if (cVar6 == '\b') {
            if (bVar16 != 0) goto LAB_00181e70;
LAB_00181e3b:
            sVar5 = acurr(3);
            uVar10 = mt_random();
            if ((int)(uVar10 % 0x19 + 1) < (int)sVar5) {
LAB_00181e70:
              potionhit(mon,obj,'\x01');
              return 1;
            }
            cVar6 = obj->oclass;
          }
        }
        if ((cVar6 == '\a') &&
           ((ppVar3 = mon->data, (ppVar3->mflags2 & 0x400000) != 0 ||
            ((urole.malenum == 0x15d &&
             (ppVar3 == mons + 0x5f ||
              ((ppVar3 == mons + 0x5e || ppVar3 == mons + 0x5c) ||
              (ppVar3 == mons + 0x5b || ppVar3 == mons + 0x5a)))))))) goto LAB_00181fb8;
        if (mon->mtame != '\0') {
          iVar19 = dogfood(mon,obj);
          if (iVar19 < 3) goto LAB_00181fb8;
          cVar6 = obj->oclass;
        }
        if (cVar6 == '\a') {
          if (urole.malenum == 0x164) {
            if (mon->data != mons + 0xef) goto LAB_001822b4;
            if ((obj->otyp == 0x11a) || (uVar10 = mt_random(), (uVar10 & 1) == 0))
            goto LAB_00181fb8;
          }
          if ((urole.malenum == 0x15b) || (urole.malenum == 0x163)) {
            if (mon->data == mons + 0x19) goto LAB_00181fb8;
          }
          else if ((urole.malenum == 0x166) &&
                  (mon->data == mons + 0x152 || mon->data == mons + 0x156)) {
LAB_00181fb8:
            pmVar15 = tamedog(mon,obj);
            if (pmVar15 == (monst *)0x0) {
              pcVar11 = xname(obj);
              miss(pcVar11,mon);
              mon->field_0x62 = mon->field_0x62 & 0xf7;
              pbVar1 = (byte *)((long)&mon->mstrategy + 3);
              *pbVar1 = *pbVar1 & 0xcf;
              return 0;
            }
            return 1;
          }
        }
LAB_001822b4:
        if (bVar16 != 0) {
          wakeup(mon);
          if ((((obj->otyp == 0x10e) && (obj->corpsenm - 0xbU < 2)) &&
              (((u.ustuck)->data->mflags1 & 0x40000) != 0)) &&
             (minstapetrify(u.ustuck,'\x01'), (u._1052_1_ & 1) == 0)) {
            delobj(obj);
            return 1;
          }
          pcVar11 = Tobjnam(obj,"vanish");
          pcVar12 = mon_nam(mon);
          pcVar12 = s_suffix(pcVar12);
          pcVar14 = "entrails";
          if (((u.ustuck)->data->mflags1 >> 0x12 & 1) == 0) {
            pcVar14 = "currents";
          }
          pline("%s into %s %s.",pcVar11,pcVar12,pcVar14);
          return 0;
        }
        goto LAB_00182309;
      }
LAB_00181973:
      iVar19 = 4;
      if (uVar18 != 9) {
        bVar4 = throwing_weapon(obj);
        iVar19 = (uint)(bVar4 != '\0') * 4 + -2;
      }
      iVar8 = weapon_hit_bonus(obj);
      iVar19 = iVar8 + iVar19 + iVar7;
    }
    uVar10 = mt_random();
    if ((int)(uVar10 % 0x14) < iVar19) {
      bVar4 = hmon(mon,obj,ostack,'\x01');
      if (bVar4 != '\0') {
        cutworm(mon,bhitpos.x,bhitpos.y,obj);
      }
      exercise(3,'\x01');
      poVar17 = obj;
      bVar4 = detonate_obj(obj,ostack,uwep,(int)bhitpos.x,(int)bhitpos.y,'\x01');
      iVar19 = (int)poVar17;
      if (bVar4 != '\0') {
        return 1;
      }
      if (((byte)objects[(short)uVar18].oc_subtyp < 0xe7) ||
         (((objects[(short)uVar18].oc_subtyp == 0xe8 && (uVar10 = mt_random(), (uVar10 & 1) == 0))
          || ((objects[(short)uVar18].field_0x10 & 0x10) != 0)))) {
        bVar20 = false;
      }
      else {
        uVar9 = *(uint *)&obj->field_0x4a >> 8 & 3;
        uVar10 = *(uint *)&obj->field_0x4a >> 10 & 3;
        if (uVar10 < uVar9) {
          uVar10 = uVar9;
        }
        iVar7 = uVar10 - (int)obj->spe;
        if (iVar7 < -1) {
          uVar10 = mt_random();
          uVar10 = (uint)((uVar10 & 3) == 0);
        }
        else {
          uVar10 = mt_random();
          uVar10 = uVar10 % (iVar7 + 3U);
        }
        if (((obj->field_0x4a & 2) != 0) && (iVar19 = rnl(iVar19), iVar19 == 0)) {
          uVar10 = 0;
        }
        bVar20 = uVar10 != 0;
      }
      if (!(bool)(cVar21 != '\0' | bVar20)) {
        passive_obj(mon,obj,(attack *)0x0);
        return 0;
      }
      if (u.ushops[0] != '\0') {
        check_shop_obj(obj,bhitpos.x,bhitpos.y,'\x01');
      }
      obfree(obj,(obj *)0x0);
      return 1;
    }
LAB_00182309:
    tmiss(obj,mon);
    return 0;
  }
  cVar6 = mon->mtame;
  pcVar11 = Monnam(mon);
  pcVar12 = xname(obj);
  pcVar12 = the(pcVar12);
  if (cVar6 != '\0') {
    pline("%s catches and drops %s.",pcVar11,pcVar12);
    return 0;
  }
  pline("%s catches %s.",pcVar11,pcVar12);
  iVar19 = sgn((int)mon->data->maligntyp);
  iVar7 = sgn((int)u.ualign.type);
  uVar18 = *(ushort *)&objects[obj->otyp].field_0x11 & 0x1f0;
  pcVar11 = Monnam(mon);
  strcpy(local_138,pcVar11);
  *(uint *)&mon->field_0x60 = *(uint *)&mon->field_0x60 & 0xffbf7fff | 0x400000;
  if (((obj->field_0x4a & 0x20) == 0) || ((objects[obj->otyp].field_0x10 & 1) == 0)) {
    if ((obj->onamelth == '\0') && (objects[obj->otyp].oc_uname == (char *)0x0)) {
      sVar13 = strlen(local_138);
      pcVar11 = local_138 + sVar13;
      if (uVar18 == 0x140) {
        if (iVar19 == iVar7) {
          builtin_strncpy(local_138 + sVar13," gratefu",8);
          *(undefined4 *)((long)&uStack_132 + sVar13 + 2) = 0x796c6c;
          cVar6 = '\x01';
        }
        else {
LAB_0018203a:
          builtin_strncpy(pcVar11," hesitatingly",0xe);
          uVar10 = mt_random();
          cVar6 = (char)uVar10 + (char)(uVar10 / 3) * -3 + -1;
        }
        goto LAB_00182199;
      }
      builtin_strncpy(local_138 + sVar13," graciou",8);
      *(undefined4 *)((long)&uStack_132 + sVar13 + 2) = 0x796c73;
    }
    else {
      sVar13 = strlen(local_138);
      pcVar11 = local_138 + sVar13;
      if (uVar18 != 0x140) goto LAB_00181ee1;
      if (iVar19 != iVar7) goto LAB_0018203a;
      builtin_strncpy(local_138 + sVar13," gratefu",8);
      *(undefined4 *)((long)&uStack_132 + sVar13 + 2) = 0x796c6c;
      cVar6 = '\x02';
LAB_00182199:
      change_luck(cVar6);
    }
    sVar13 = strlen(local_138);
    builtin_strncpy(local_138 + sVar13," accepts",8);
    builtin_strncpy((char *)((long)&uStack_132 + sVar13 + 2)," your gi",8);
    *(undefined4 *)((long)auStack_128 + sVar13) = 0x2e7466;
    if (u.ushops[0] != '\0') {
      check_shop_obj(obj,mon->mx,mon->my,'\x01');
    }
    mpickobj(mon,obj);
    iVar19 = 1;
  }
  else {
    sVar13 = strlen(local_138);
    pcVar11 = local_138 + sVar13;
    if (uVar18 == 0x140) {
      if (iVar19 == iVar7) {
        builtin_strncpy(local_138 + sVar13," gratefu",8);
        *(undefined4 *)((long)&uStack_132 + sVar13 + 2) = 0x796c6c;
        cVar6 = '\x05';
      }
      else {
        *(undefined8 *)((long)&uStack_132 + sVar13) = 0x796c676e697461;
        builtin_strncpy(local_138 + sVar13," hesitat",8);
        uVar10 = mt_random();
        cVar6 = (char)(uVar10 / 7) * -7 + (char)uVar10 + -3;
      }
      goto LAB_00182199;
    }
LAB_00181ee1:
    builtin_strncpy(pcVar11," is not interested in your junk.",0x21);
    iVar19 = 0;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00182204;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001821ff;
  }
  else {
LAB_001821ff:
    if (ublindf == (obj *)0x0) goto LAB_0018223d;
LAB_00182204:
    if (ublindf->oartifact != '\x1d') goto LAB_0018223d;
  }
  pline("%s",local_138);
LAB_0018223d:
  bVar4 = tele_restrict(mon);
  if (bVar4 == '\0') {
    rloc(level,mon,'\0');
    return iVar19;
  }
  return iVar19;
}

Assistant:

int thitmonst(struct monst *mon, struct obj *obj, struct obj *ostack)
{
	int	tmp; /* Base chance to hit */
	int	disttmp; /* distance modifier */
	int otyp = obj->otyp;
	boolean guaranteed_hit = (u.uswallow && mon == u.ustuck);
	boolean obj_disint = (touch_disintegrates(mon->data) &&
			      !mon->mcan &&
			      (mon->mhp > 1) &&
			      !oresist_disintegration(obj));

	/* Differences from melee weapons:
	 *
	 * Dex still gives a bonus, but strength does not.
	 * Polymorphed players lacking attacks may still throw.
	 * There's a base -1 to hit.
	 * No bonuses for fleeing or stunned targets (they don't dodge
	 *    melee blows as readily, but dodging arrows is hard anyway).
	 * Not affected by traps, etc.
	 * Certain items which don't in themselves do damage ignore tmp.
	 * Distance and monster size affect chance to hit.
	 */
	tmp = -1 + Luck / 3 + find_mac(mon) + u.uhitinc +
			maybe_polyd(youmonst.data->mlevel, u.ulevel);
	if (ACURR(A_DEX) < 4) tmp -= 3;
	else if (ACURR(A_DEX) < 6) tmp -= 2;
	else if (ACURR(A_DEX) < 8) tmp -= 1;
	else if (ACURR(A_DEX) >= 14) tmp += (ACURR(A_DEX) - 14);

	/* Modify to-hit depending on distance; but keep it sane.
	 * Polearms get a distance penalty even when wielded; it's
	 * hard to hit at a distance.
	 */
	disttmp = 3 - distmin(u.ux, u.uy, mon->mx, mon->my);
	if (disttmp < -4) disttmp = -4;
	tmp += disttmp;

	/* gloves are a hinderance to proper use of bows */
	if (uarmg && uwep && objects[uwep->otyp].oc_skill == P_BOW) {
	    switch (uarmg->otyp) {
	    case GAUNTLETS_OF_POWER:    /* metal */
		tmp -= 2;
		break;
	    case GAUNTLETS_OF_FUMBLING:
		tmp -= 3;
		break;
	    case LEATHER_GLOVES:
	    case GAUNTLETS_OF_DEXTERITY:
		break;
	    default:
		warning("Unknown type of gloves (%d)", uarmg->otyp);
		break;
	    }
	}

	tmp += omon_adj(mon, obj, TRUE);
	if (is_orc(mon->data) && maybe_polyd(is_elf(youmonst.data),
			Race_if (PM_ELF)))
	    tmp++;
	if (guaranteed_hit) {
	    tmp += 1000; /* Guaranteed hit */
	}

	if (obj->oclass == GEM_CLASS && is_unicorn(mon->data)) {
	    if (mon->mtame) {
		pline("%s catches and drops %s.", Monnam(mon), the(xname(obj)));
		return 0;
	    } else {
		pline("%s catches %s.", Monnam(mon), the(xname(obj)));
		return gem_accept(mon, obj);
	    }
	}

	/* don't make game unwinnable if naive player throws artifact
	   at leader.... */
	if (quest_arti_hits_leader(obj, mon)) {
	    /* not wakeup(), which angers non-tame monsters */
	    mon->msleeping = 0;
	    mon->mstrategy &= ~STRAT_WAITMASK;

	    if (mon->mcanmove) {
		pline("%s catches %s.", Monnam(mon), the(xname(obj)));
		if (mon->mpeaceful) {
		    boolean next2u = monnear(mon, u.ux, u.uy);

		    finish_quest(obj);	/* acknowledge quest completion */
		    pline("%s %s %s back to you.", Monnam(mon),
			  (next2u ? "hands" : "tosses"), the(xname(obj)));
		    if (!next2u) {
			schar dx = sgn(mon->mx - u.ux);
			schar dy = sgn(mon->my - u.uy);
			sho_obj_return_to_u(obj, dx, dy);
		    }
		    addinv(obj);	/* back into your inventory */
		    encumber_msg();
		} else {
		    /* angry leader caught it and isn't returning it */
		    mpickobj(mon, obj);
		}
		return 1;		/* caller doesn't need to place it */
	    }
	    return 0;
	}

	if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
		obj->oclass == GEM_CLASS) {
	    if (is_ammo(obj)) {
		if (!ammo_and_launcher(obj, uwep)) {
		    tmp -= 4;
		} else {
		    tmp += uwep->spe - greatest_erosion(uwep);
		    tmp += weapon_hit_bonus(uwep);
		    if (uwep->oartifact) tmp += spec_abon(uwep, mon);
		    /*
		     * Elves and Samurais are highly trained w/bows,
		     * especially their own special types of bow.
		     * Polymorphing won't make you a bow expert.
		     */
		    if ((Race_if (PM_ELF) || Role_if(PM_SAMURAI)) &&
				(!Upolyd || your_race(youmonst.data)) &&
				objects[uwep->otyp].oc_skill == P_BOW) {
			tmp++;
			if (Race_if (PM_ELF) && uwep->otyp == ELVEN_BOW)
			    tmp++;
			else if (Role_if (PM_SAMURAI) && uwep->otyp == YUMI)
			    tmp++;
		    }
		}
	    } else {
		if (otyp == BOOMERANG)		/* arbitrary */
		    tmp += 4;
		else if (throwing_weapon(obj))	/* meant to be thrown */
		    tmp += 2;
		else				/* not meant to be thrown */
		    tmp -= 2;
		/* we know we're dealing with a weapon or weptool handled
		   by WEAPON_SKILLS once ammo objects have been excluded */
		tmp += weapon_hit_bonus(obj);
	    }

	    if (tmp >= rnd(20)) {
		int broken = FALSE;
		if (hmon(mon, obj, ostack, TRUE)) {	/* mon still alive */
		    cutworm(mon, bhitpos.x, bhitpos.y, obj);
		}
		exercise(A_DEX, TRUE);
		if (detonate_obj(obj, ostack, uwep, bhitpos.x, bhitpos.y, TRUE))
		    return 1;
		/* projectiles other than shuriken, crossbow bolts (half the
		   time) and magic stones sometimes disappear when thrown */
		if (objects[otyp].oc_skill < P_NONE &&
				objects[otyp].oc_skill > -P_BOOMERANG &&
				objects[otyp].oc_skill != -P_SHURIKEN &&
				!(objects[otyp].oc_skill == -P_CROSSBOW && !rn2(2)) &&
				!objects[otyp].oc_magic) {
		    /* we were breaking 2/3 of everything unconditionally.
		     * we still don't want anything to survive unconditionally,
		     * but we need ammo to stay around longer on average.
		     */
		    int chance;
		    chance = 3 + greatest_erosion(obj) - obj->spe;
		    if (chance > 1)
			broken = rn2(chance);
		    else
			broken = !rn2(4);
		    if (obj->blessed && !rnl(4))
			broken = 0;
		}
		if (broken || obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
		passive_obj(mon, obj, NULL);
	    } else {
		tmiss(obj, mon);
	    }

	} else if (otyp == HEAVY_IRON_BALL) {
	    exercise(A_STR, TRUE);
	    if (tmp >= rnd(20)) {
		int was_swallowed = guaranteed_hit;

		exercise(A_DEX, TRUE);
		if (!hmon(mon, obj, ostack, TRUE)) {	/* mon killed */
		    if (was_swallowed && !u.uswallow && obj == uball)
			return 1;	/* already did placebc() */
		}

		if (obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
	    } else {
		tmiss(obj, mon);
	    }

	} else if (otyp == BOULDER) {
	    exercise(A_STR, TRUE);
	    if (tmp >= rnd(20)) {
		exercise(A_DEX, TRUE);
		hmon(mon, obj, ostack, TRUE);
		if (obj_disint) {
		    if (*u.ushops)
			check_shop_obj(obj, bhitpos.x,bhitpos.y, TRUE);
		    obfree(obj, NULL);
		    return 1;
		}
	    } else {
		tmiss(obj, mon);
	    }

	} else if ((otyp == EGG || otyp == CREAM_PIE ||
		    otyp == BLINDING_VENOM || otyp == ACID_VENOM) &&
		(guaranteed_hit || ACURR(A_DEX) > rnd(25))) {
	    hmon(mon, obj, ostack, TRUE);
	    return 1;	/* hmon used it up */

	} else if (obj->oclass == POTION_CLASS &&
		(guaranteed_hit || ACURR(A_DEX) > rnd(25))) {
	    potionhit(mon, obj, TRUE);
	    return 1;

	} else if (befriend_with_obj(mon->data, obj) ||
		   (mon->mtame && dogfood(mon, obj) <= ACCFOOD) ||
		   (obj->oclass == FOOD_CLASS &&
		    ((Role_if(PM_ROGUE) &&
		       mon->data == &mons[PM_MONKEY] &&
		      (obj->otyp == BANANA || !rn2(2))) ||
		     (Role_if(PM_TOURIST) &&
		      (mon->data == &mons[PM_CROCODILE] ||
		       mon->data == &mons[PM_BABY_CROCODILE])) ||
		     ((Role_if(PM_RANGER) || Role_if(PM_CAVEMAN)) &&
		       mon->data == &mons[PM_WINTER_WOLF_CUB])))) {
	    if (tamedog(mon, obj))
		return 1;           	/* obj is gone */
	    else {
		/* not tmiss(), which angers non-tame monsters */
		miss(xname(obj), mon);
		mon->msleeping = 0;
		mon->mstrategy &= ~STRAT_WAITMASK;
	    }
	} else if (guaranteed_hit) {
	    /* this assumes that guaranteed_hit is due to swallowing */
	    wakeup(mon);
	    if (obj->otyp == CORPSE && touch_petrifies(&mons[obj->corpsenm])) {
		if (is_animal(u.ustuck->data)) {
			minstapetrify(u.ustuck, TRUE);
			/* Don't leave a cockatrice corpse available in a statue */
			if (!u.uswallow) {
				delobj(obj);
				return 1;
			}
	    	}
	    }
	    pline("%s into %s %s.",
		Tobjnam(obj, "vanish"), s_suffix(mon_nam(mon)),
		is_animal(u.ustuck->data) ? "entrails" : "currents");
	} else {
	    tmiss(obj, mon);
	}

	return 0;
}